

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkheader.cpp
# Opt level: O0

void __thiscall
QHttpNetworkHeaderPrivate::setContentLength(QHttpNetworkHeaderPrivate *this,qint64 length)

{
  int in_ESI;
  QHttpNetworkHeaderPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffff98;
  undefined1 local_38 [24];
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray(&local_20,"Content-Length",-1);
  QByteArray::number((longlong)local_38,in_ESI);
  setHeaderField(in_RDI,in_stack_ffffffffffffff98,(QByteArray *)0x303734);
  QByteArray::~QByteArray((QByteArray *)0x30373e);
  QByteArray::~QByteArray((QByteArray *)0x303748);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkHeaderPrivate::setContentLength(qint64 length)
{
    setHeaderField("Content-Length", QByteArray::number(length));
}